

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser_tag.cpp
# Opt level: O3

void __thiscall despot::LaserTag::LaserTag(LaserTag *this,string *params_file)

{
  pointer pcVar1;
  string local_38;
  
  pcVar1 = (params_file->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + params_file->_M_string_length);
  BaseTag::BaseTag(&this->super_BaseTag,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&this->super_BaseTag = &PTR__LaserTag_0011f9f8;
  *(undefined ***)&(this->super_BaseTag).super_BeliefMDP = &PTR__LaserTag_0011fb28;
  *(undefined ***)&(this->super_BaseTag).super_StateIndexer = &PTR__LaserTag_0011fc30;
  *(undefined ***)&(this->super_BaseTag).super_StatePolicy = &PTR__LaserTag_0011fc68;
  *(undefined ***)&(this->super_BaseTag).super_MMAPInferencer = &PTR__LaserTag_0011fc90;
  this->noise_sigma_ = 2.5;
  this->unit_size_ = 1.0;
  (this->reading_distributions_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->reading_distributions_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->reading_distributions_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Init(this);
  (this->super_BaseTag).robot_pos_unknown_ = false;
  return;
}

Assistant:

LaserTag::LaserTag(string params_file) :
	BaseTag(params_file),
	noise_sigma_(2.5),
	unit_size_(1.0) {
	Init();
  robot_pos_unknown_ = false;
}